

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O3

void __thiscall
QSocks5SocketEnginePrivate::parseRequestMethodReply(QSocks5SocketEnginePrivate *this)

{
  byte bVar1;
  QAbstractSocketEngine *this_00;
  QObject *pQVar2;
  int iVar3;
  Socks5State state;
  long lVar4;
  long in_FS_OFFSET;
  int pos;
  quint16 port;
  QHostAddress address;
  int local_78;
  quint16 local_72;
  QHostAddress local_70;
  QByteArray local_68;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char *)0x0;
  local_68.d.size = 0;
  QSocks5Authenticator::unSeal((QSocks5Authenticator *)this,this->data->controlSocket,&local_68);
  QByteArray::prepend(&local_68);
  QByteArray::clear();
  if ((ulong)local_68.d.size < 3) {
    QByteArray::operator=(&this->receivedHeaderFragment,&local_68);
    goto LAB_0023946b;
  }
  local_70.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&local_70);
  local_72 = 0;
  if ((*local_68.d.ptr == '\x05') && (local_68.d.ptr[2] == '\0')) {
    bVar1 = local_68.d.ptr[1];
    if (bVar1 != 0) {
      if ((bVar1 < 3) && ((this->peerName).d.size != 0)) {
        state = HostNameLookupError;
        goto LAB_002392fd;
      }
      setErrorState(this,RequestError,(int)(char)bVar1);
      goto LAB_00239302;
    }
    local_78 = 3;
    iVar3 = qt_socks5_get_host_address_and_port(&local_68,&local_70,&local_72,&local_78);
    if (iVar3 != 0) {
      if (iVar3 == -1) goto LAB_002392e2;
      QByteArray::remove((longlong)&local_68,0);
      if (-1 < (int)((int)local_68.d.size - 1U)) {
        lVar4 = (ulong)((int)local_68.d.size - 1U) + 1;
        do {
          QIODevice::ungetChar((char)this->data->controlSocket);
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
      }
      goto LAB_00239302;
    }
    QByteArray::operator=(&this->receivedHeaderFragment,&local_68);
  }
  else {
LAB_002392e2:
    state = SocksError;
LAB_002392fd:
    local_48.d.size = 0;
    local_48.d.ptr = (char16_t *)0x0;
    local_48.d.d = (Data *)0x0;
    setErrorState(this,state,&local_48);
LAB_00239302:
    if (this->socks5State == BindSuccess) {
      QHostAddress::operator=(&this->bindData->peerAddress,&local_70);
      this->bindData->peerPort = local_72;
      emitReadNotification(this);
    }
    else if (this->socks5State == RequestMethodSent) {
      QHostAddress::operator=(&(this->super_QAbstractSocketEnginePrivate).localAddress,&local_70);
      (this->super_QAbstractSocketEnginePrivate).localPort = local_72;
      if (this->mode == BindMode) {
        this->socks5State = BindSuccess;
        QAbstractSocketEngine::setState(this_00,ListeningState);
      }
      else {
        if (this->mode == ConnectMode) {
          (this->super_QAbstractSocketEnginePrivate).inboundStreamCount = 1;
          (this->super_QAbstractSocketEnginePrivate).outboundStreamCount = 1;
          this->socks5State = Connected;
          QAbstractSocketEngine::setState(this_00,ConnectedState);
          goto LAB_002393b7;
        }
        this->socks5State = UdpAssociateSuccess;
      }
    }
    else {
      (**(code **)(*(long *)&this->data->controlSocket->super_QAbstractSocket + 0x70))();
LAB_002393b7:
      pQVar2 = *(QObject **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
      this->connectionNotificationPending = true;
      local_48.d.d = (Data *)0x0;
      local_48.d.ptr = (char16_t *)0x0;
      local_48.d.size = 0;
      QMetaObject::invokeMethodImpl
                (pQVar2,"_q_emitPendingConnectionNotification",QueuedConnection,1,(void **)&local_48
                 ,(char **)&local_48.d.ptr,(QMetaTypeInterface **)&local_48.d.size);
    }
  }
  QHostAddress::~QHostAddress(&local_70);
LAB_0023946b:
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::parseRequestMethodReply()
{
    Q_Q(QSocks5SocketEngine);
    QSOCKS5_DEBUG << "parseRequestMethodReply()";

    QByteArray inBuf;
    if (!data->authenticator->unSeal(data->controlSocket, &inBuf)) {
        // ### check error and not just not enough data
        QSOCKS5_DEBUG << "unSeal failed, needs more data";
        return;
    }

    inBuf.prepend(receivedHeaderFragment);
    receivedHeaderFragment.clear();
    QSOCKS5_DEBUG << dump(inBuf);
    if (inBuf.size() < 3) {
        QSOCKS5_DEBUG << "need more data for request reply header .. put this data somewhere";
        receivedHeaderFragment = inBuf;
        return;
    }

    QHostAddress address;
    quint16 port = 0;

    if (inBuf.at(0) != S5_VERSION_5 || inBuf.at(2) != 0x00) {
        QSOCKS5_DEBUG << "socks protocol error";
        setErrorState(SocksError);
    } else if (inBuf.at(1) != S5_SUCCESS) {
        Socks5Error socks5Error = Socks5Error(inBuf.at(1));
        QSOCKS5_DEBUG <<  "Request error :" << socks5Error;
        if ((socks5Error == SocksFailure || socks5Error == ConnectionNotAllowed)
            && !peerName.isEmpty()) {
            // Dante seems to use this error code to indicate hostname resolution failure
            setErrorState(HostNameLookupError);
        } else {
            setErrorState(RequestError, socks5Error);
        }
    } else {
        // connection success, retrieve the remote addresses
        int pos = 3;
        int err = qt_socks5_get_host_address_and_port(inBuf, &address, &port, &pos);
        if (err == -1) {
            QSOCKS5_DEBUG << "error getting address";
            setErrorState(SocksError);
        } else if (err == 0) {
            //need more data
            receivedHeaderFragment = inBuf;
            return;
        } else {
            inBuf.remove(0, pos);
            for (int i = inBuf.size() - 1; i >= 0 ; --i)
                data->controlSocket->ungetChar(inBuf.at(i));
        }
    }

    if (socks5State == RequestMethodSent) {
        // no error
        localAddress = address;
        localPort = port;

        if (mode == ConnectMode) {
            inboundStreamCount = outboundStreamCount = 1;
            socks5State = Connected;
            // notify the upper layer that we're done
            q->setState(QAbstractSocket::ConnectedState);
            emitConnectionNotification();
        } else if (mode == BindMode) {
            socks5State = BindSuccess;
            q->setState(QAbstractSocket::ListeningState);
        } else {
            socks5State = UdpAssociateSuccess;
        }
    } else if (socks5State == BindSuccess) {
        // no error and we got a connection
        bindData->peerAddress = address;
        bindData->peerPort = port;

        emitReadNotification();
    } else {
        // got an error
        data->controlSocket->close();
        emitConnectionNotification();
    }
}